

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall
fasttext::DenseMatrix::multiplyRow(DenseMatrix *this,Vector *nums,int64_t ib,int64_t ie)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  
  if (ie == -1) {
    ie = (this->super_Matrix).m_;
  }
  if (ie <= (long)(nums->data_).size_) {
    pfVar2 = (nums->data_).mem_;
    lVar3 = (this->super_Matrix).n_;
    lVar6 = 0;
    if (0 < lVar3) {
      lVar6 = lVar3;
    }
    lVar7 = lVar3 * ib * 4;
    for (iVar8 = ib; iVar8 < ie; iVar8 = iVar8 + 1) {
      fVar1 = pfVar2[iVar8 - ib];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        pfVar4 = (this->data_).mem_;
        for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
          *(float *)((long)pfVar4 + lVar5 * 4 + lVar7) =
               *(float *)((long)pfVar4 + lVar5 * 4 + lVar7) * fVar1;
        }
      }
      lVar7 = lVar7 + lVar3 * 4;
    }
    return;
  }
  __assert_fail("ie <= nums.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/densematrix.cc"
                ,0x44,"void fasttext::DenseMatrix::multiplyRow(const Vector &, int64_t, int64_t)");
}

Assistant:

void DenseMatrix::multiplyRow(const Vector& nums, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= nums.size());
  for (auto i = ib; i < ie; i++) {
    real n = nums[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) *= n;
      }
    }
  }
}